

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  byte bVar1;
  byte bVar2;
  u8 uVar3;
  Schema *pSVar4;
  Schema *pSVar5;
  char *p;
  int iVar6;
  Incrblob *pIVar7;
  Table *pTVar8;
  Index *pIVar9;
  Vdbe *p_00;
  VdbeOp *pVVar10;
  long lVar11;
  Schema **ppSVar12;
  sqlite3 *psVar13;
  int iVar14;
  FKey *pFVar15;
  uint uVar16;
  Vdbe *v;
  char *pcVar17;
  uint uVar18;
  ulong uVar19;
  char *zErr;
  Parse sParse;
  int local_220;
  char *local_218;
  Table *local_210;
  int local_208;
  uint local_204;
  char *local_200;
  sqlite3 *local_1f8;
  Incrblob *local_1f0;
  VdbeOp *local_1e8;
  sqlite_int64 local_1e0;
  char *local_1d8;
  Parse local_1d0;
  
  local_218 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_208 = wrFlag;
  local_200 = zTable;
  local_1e0 = iRow;
  local_1d8 = zDb;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  pIVar7 = (Incrblob *)sqlite3DbMallocZero(db,0x38);
  local_220 = 0;
  local_204 = 0;
  local_1f8 = db;
  local_1f0 = pIVar7;
LAB_0013ba01:
  memset(&local_1d0.zErrMsg,0,0xd8);
  memset(&local_1d0.sLastToken,0,0x88);
  local_1d0.pOuterParse = db->pParse;
  db->pParse = &local_1d0;
  local_1d0.db = db;
  if (db->mallocFailed != '\0') {
    sqlite3ErrorMsg(&local_1d0,"out of memory");
  }
  if (pIVar7 != (Incrblob *)0x0) {
    if (local_218 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_218);
    }
    local_218 = (char *)0x0;
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    pTVar8 = sqlite3LocateTable(&local_1d0,0,local_200,local_1d8);
    if (pTVar8 == (Table *)0x0) {
      pTVar8 = (Table *)0x0;
    }
    else if (pTVar8->eTabType == '\x01') {
      sqlite3ErrorMsg(&local_1d0,"cannot open virtual table: %s",local_200);
      pTVar8 = (Table *)0x0;
    }
    if (pTVar8 == (Table *)0x0) {
LAB_0013bb1c:
      pTVar8 = (Table *)0x0;
    }
    else if ((pTVar8->tabFlags & 0x80) != 0) {
      sqlite3ErrorMsg(&local_1d0,"cannot open table without rowid: %s",local_200);
      goto LAB_0013bb1c;
    }
    if (pTVar8 == (Table *)0x0) {
LAB_0013bb48:
      pTVar8 = (Table *)0x0;
    }
    else if (pTVar8->eTabType == '\x02') {
      sqlite3ErrorMsg(&local_1d0,"cannot open view: %s",local_200);
      goto LAB_0013bb48;
    }
    if (pTVar8 != (Table *)0x0) {
      pIVar7->pTab = pTVar8;
      if (pTVar8->pSchema == (Schema *)0x0) {
        lVar11 = -0x8000;
      }
      else {
        lVar11 = -0x100000000;
        ppSVar12 = &db->aDb->pSchema;
        do {
          lVar11 = lVar11 + 0x100000000;
          pSVar4 = *ppSVar12;
          ppSVar12 = ppSVar12 + 4;
        } while (pSVar4 != pTVar8->pSchema);
        lVar11 = lVar11 >> 0x20;
      }
      pIVar7->zDb = db->aDb[lVar11].zDbSName;
      uVar16 = (uint)pTVar8->nCol;
      if (0 < pTVar8->nCol) {
        uVar19 = 0;
LAB_0013bbb5:
        lVar11 = 0;
        do {
          bVar1 = pTVar8->aCol[uVar19].zCnName[lVar11];
          bVar2 = zColumn[lVar11];
          if (bVar1 == bVar2) {
            if ((ulong)bVar1 == 0) goto LAB_0013bbe7;
          }
          else if (""[bVar1] != ""[bVar2]) goto LAB_0013bbe7;
          lVar11 = lVar11 + 1;
        } while( true );
      }
      uVar18 = 0;
      goto LAB_0013bc01;
    }
    if (local_1d0.zErrMsg != (char *)0x0) {
      local_218 = local_1d0.zErrMsg;
      local_1d0.zErrMsg = (char *)0x0;
    }
    uVar3 = db->noSharedCache;
    goto joined_r0x0013bf83;
  }
  local_220 = 0;
  goto LAB_0013bf23;
LAB_0013bbe7:
  if (bVar1 == bVar2) goto LAB_0013bbf7;
  uVar19 = uVar19 + 1;
  if (uVar19 == uVar16) goto code_r0x0013bbf4;
  goto LAB_0013bbb5;
code_r0x0013bbf4:
  uVar19 = (ulong)uVar16;
LAB_0013bbf7:
  uVar18 = (uint)uVar19;
LAB_0013bc01:
  local_210 = pTVar8;
  if (uVar18 == uVar16) {
    local_218 = sqlite3MPrintf(db,"no such column: \"%s\"",zColumn);
    uVar3 = db->noSharedCache;
    pIVar7 = local_1f0;
joined_r0x0013bf83:
    local_220 = 1;
    if (uVar3 == '\0') {
      btreeLeaveAll(db);
      local_220 = 1;
    }
LAB_0013bf23:
    if ((local_220 == 0) && (db->mallocFailed == '\0')) {
      *ppBlob = (sqlite3_blob *)pIVar7;
    }
    else if (pIVar7 != (Incrblob *)0x0) {
      if ((Vdbe *)pIVar7->pStmt != (Vdbe *)0x0) {
        sqlite3VdbeFinalize((Vdbe *)pIVar7->pStmt);
      }
      if (pIVar7 != (Incrblob *)0x0) {
        sqlite3DbFreeNN(db,pIVar7);
      }
    }
    p = local_218;
    pcVar17 = "%s";
    if (local_218 == (char *)0x0) {
      pcVar17 = (char *)0x0;
    }
    iVar14 = 0;
    sqlite3ErrorWithMsg(db,local_220,pcVar17,local_218);
    if (p != (char *)0x0) {
      sqlite3DbFreeNN(db,p);
    }
    sqlite3ParseObjectReset(&local_1d0);
    if ((local_220 != 0) || (db->mallocFailed != '\0')) {
      iVar14 = apiHandleError(db,local_220);
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
    return iVar14;
  }
  if (local_208 != 0) {
    if (((db->flags & 0x4000) == 0) || (pFVar15 = (pTVar8->u).tab.pFKey, pFVar15 == (FKey *)0x0)) {
      pcVar17 = (char *)0x0;
    }
    else {
      pcVar17 = (char *)0x0;
      do {
        if (0 < (long)pFVar15->nCol) {
          lVar11 = 0;
          do {
            if (*(uint *)((long)&pFVar15->aCol[0].iFrom + lVar11) == uVar18) {
              pcVar17 = "foreign key";
            }
            lVar11 = lVar11 + 0x10;
          } while ((long)pFVar15->nCol * 0x10 != lVar11);
        }
        pFVar15 = pFVar15->pNextFrom;
      } while (pFVar15 != (FKey *)0x0);
    }
    for (pIVar9 = pTVar8->pIndex; pIVar9 != (Index *)0x0; pIVar9 = pIVar9->pNext) {
      if ((ulong)pIVar9->nKeyCol != 0) {
        uVar19 = 0;
        do {
          if (uVar18 == (int)pIVar9->aiColumn[uVar19]) {
            pcVar17 = "indexed";
          }
          if ((int)pIVar9->aiColumn[uVar19] == 0xfffffffe) {
            pcVar17 = "indexed";
          }
          uVar19 = uVar19 + 1;
        } while (pIVar9->nKeyCol != uVar19);
      }
    }
    if (pcVar17 != (char *)0x0) {
      local_218 = sqlite3MPrintf(db,"cannot open %s column for writing",pcVar17);
      local_220 = 1;
      if (db->noSharedCache == '\0') {
        btreeLeaveAll(db);
      }
    }
    pIVar7 = local_1f0;
    if (pcVar17 != (char *)0x0) goto LAB_0013bf23;
  }
  pIVar7 = local_1f0;
  p_00 = sqlite3VdbeCreate(&local_1d0);
  pIVar7->pStmt = (sqlite3_stmt *)p_00;
  if (p_00 != (Vdbe *)0x0) {
    pSVar4 = local_210->pSchema;
    if (pSVar4 == (Schema *)0x0) {
      iVar14 = -0x8000;
    }
    else {
      iVar14 = -1;
      ppSVar12 = &local_1f8->aDb->pSchema;
      do {
        iVar14 = iVar14 + 1;
        pSVar5 = *ppSVar12;
        ppSVar12 = ppSVar12 + 4;
      } while (pSVar5 != pSVar4);
    }
    local_1e8 = (VdbeOp *)CONCAT44(local_1e8._4_4_,pSVar4->iGeneration);
    iVar6 = sqlite3VdbeAddOp3(p_00,2,iVar14,(uint)(wrFlag != 0),pSVar4->schema_cookie);
    psVar13 = p_00->db;
    if (psVar13->mallocFailed == '\0') {
      psVar13 = (sqlite3 *)p_00->aOp;
      *(undefined1 *)((long)&psVar13->pVfs + (long)iVar6 * 0x18 + 1) = 0xfd;
      psVar13->aLimit[(long)iVar6 * 6 + -0x1e] = (int)local_1e8;
    }
    if (0 < (long)p_00->nOp) {
      psVar13 = (sqlite3 *)p_00->aOp;
      *(undefined2 *)((long)psVar13 + ((long)p_00->nOp + -1) * 0x18 + 2) = 1;
    }
    pVVar10 = sqlite3VdbeAddOpList(p_00,6,sqlite3_blob_open::openBlob,(int)psVar13);
    uVar16 = 1 << ((byte)iVar14 & 0x1f);
    p_00->btreeMask = p_00->btreeMask | uVar16;
    if ((iVar14 != 1) && ((p_00->db->aDb[iVar14].pBt)->sharable != '\0')) {
      p_00->lockMask = p_00->lockMask | uVar16;
    }
    if (local_1f8->mallocFailed == '\0') {
      pVVar10->p1 = iVar14;
      pVVar10->p2 = local_210->tnum;
      pVVar10->p3 = (uint)(wrFlag != 0);
      local_1e8 = pVVar10;
      sqlite3VdbeChangeP4(p_00,2,local_210->zName,0);
      pVVar10 = local_1e8;
    }
    if (local_1f8->mallocFailed == '\0') {
      if (local_208 != 0) {
        pVVar10[1].opcode = 'q';
      }
      pVVar10[1].p2 = local_210->tnum;
      pVVar10[1].p3 = iVar14;
      pVVar10[1].p4type = -3;
      pVVar10[1].p4.i = local_210->nCol + 1;
      pVVar10[3].p2 = (int)local_210->nCol;
      local_1d0.nVar = 0;
      local_1d0.nTab = 1;
      local_1d0.nMem = 1;
      sqlite3VdbeMakeReady(p_00,&local_1d0);
    }
  }
  pIVar7 = local_1f0;
  db = local_1f8;
  local_1f0->iCol = (u16)uVar18;
  local_1f0->db = local_1f8;
  if (local_1f8->noSharedCache == '\0') {
    btreeLeaveAll(local_1f8);
  }
  if (((db->mallocFailed != '\0') ||
      (local_220 = blobSeekToRow(pIVar7,local_1e0,&local_218), 0x30 < local_204)) ||
     (local_220 != 0x11)) goto LAB_0013bf23;
  local_204 = local_204 + 1;
  sqlite3ParseObjectReset(&local_1d0);
  local_220 = 0x11;
  goto LAB_0013ba01;
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Incrblob *pBlob = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  while(1){
    sqlite3ParseObjectInit(&sParse,db);
    if( !pBlob ) goto blob_open_out;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(&sParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && IsView(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( sParse.zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = sParse.zErrMsg;
        sParse.zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zCnName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key.
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this
        ** case.  */
        FKey *pFKey;
        assert( IsOrdinaryTable(pTab) );
        for(pFKey=pTab->u.tab.pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(&sParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){

      /* This VDBE program seeks a btree cursor to the identified
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag,
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);
      assert( sqlite3VdbeCurrentAddr(v)==2 || db->mallocFailed );
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb);

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        sParse.nVar = 0;
        sParse.nMem = 1;
        sParse.nTab = 1;
        sqlite3VdbeMakeReady(v, &sParse);
      }
    }

    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
    if( (++nAttempt)>=SQLITE_MAX_SCHEMA_RETRY || rc!=SQLITE_SCHEMA ) break;
    sqlite3ParseObjectReset(&sParse);
  }

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParseObjectReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}